

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<1,452>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<1,452> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  double dVar1;
  int iVar2;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_1_452_hpp:53:42),_const_std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>_&>
  _Var3;
  int local_80;
  int local_7c;
  StructureDivision local_78;
  
  iVar2 = *(int *)this;
  dVar1 = *(double *)(this + 8);
  local_80 = MF;
  local_7c = MAT;
  _Var3 = std::
          visit<njoy::ENDFtk::section::Type<1,452>::LNU()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>const&>
                    ((anon_class_1_0_00000001 *)&local_78,
                     (variant<njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                      *)(this + 0x10));
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)_Var3;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar1;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)iVar2;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_78,it,local_7c,local_80,0x1c4);
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)this;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = (long)it;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_7c;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&local_80;
  std::
  visit<njoy::ENDFtk::section::Type<1,452>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>const&>
            ((anon_class_32_4_c8a9f2b7 *)&local_78,
             (variant<njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
              *)(this + 0x10));
  sectionEndRecord(&local_78,local_7c,local_80);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_78,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  ControlRecord( this->ZA(), this->AWR(), 0,
                 this->LNU(), 0, 0 ).print( it, MAT, MF, this->MT() );
  std::visit( [&] ( const auto& v ) -> void
                  { v.print( it, MAT, MF, this->MT() ); },
              this->nubar() );
  SEND( MAT, MF ).print( it );
}